

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::declare_constant_arrays(CompilerMSL *this)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRConstant *c;
  SPIRType *type;
  undefined1 *extraout_RAX;
  undefined1 *puVar5;
  undefined8 uVar6;
  TypedID<(spirv_cross::Types)0> *pTVar7;
  string name;
  LoopLock LStack_a8;
  uint local_9c;
  size_t local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&LStack_a8);
    return;
  }
  pTVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  pTVar1 = pTVar7 + sVar2;
  uVar6 = 0;
  do {
    local_9c = (uint)uVar6;
    while( true ) {
      pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if ((((pVVar3[pTVar7->id].type == TypeConstant) &&
           (c = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + pTVar7->id),
           c->specialization == false)) &&
          (type = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(c->super_IVariant).field_0xc),
          (type->array).super_VectorView<unsigned_int>.buffer_size != 0)) &&
         (((local_98 != 1 || (bVar4 = Compiler::is_scalar((Compiler *)this,type), bVar4)) ||
          (bVar4 = Compiler::is_vector((Compiler *)this,type), bVar4)))) break;
      pTVar7 = pTVar7 + 1;
      if (pTVar7 == pTVar1) {
        ParsedIR::LoopLock::~LoopLock(&LStack_a8);
        if ((local_9c & 1) == 0) {
          return;
        }
        goto LAB_0025f54a;
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_50,this,(ulong)(c->super_IVariant).self.id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
              (&local_90,this,type,local_50,0);
    CompilerGLSL::constant_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,c);
    CompilerGLSL::
    statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [10])"constant ",&local_90,(char (*) [4])0x2f38c7
               ,&local_70,(char (*) [2])0x2d9bde);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    puVar5 = local_40;
    if (local_50[0] != puVar5) {
      operator_delete(local_50[0]);
      puVar5 = extraout_RAX;
    }
    pTVar7 = pTVar7 + 1;
    uVar6 = CONCAT71((int7)((ulong)puVar5 >> 8),1);
  } while (pTVar7 != pTVar1);
  ParsedIR::LoopLock::~LoopLock(&LStack_a8);
LAB_0025f54a:
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2d80a2);
  return;
}

Assistant:

void CompilerMSL::declare_constant_arrays()
{
	bool fully_inlined = ir.ids_for_type[TypeFunction].size() == 1;

	// MSL cannot declare arrays inline (except when declaring a variable), so we must move them out to
	// global constants directly, so we are able to use constants as variable expressions.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries.
		// FIXME: However, hoisting constants to main() means we need to pass down constant arrays to leaf functions if they are used there.
		// If there are multiple functions in the module, drop this case to avoid breaking use cases which do not need to
		// link into Metal libraries. This is hacky.
		if (!type.array.empty() && (!fully_inlined || is_scalar(type) || is_vector(type)))
		{
			auto name = to_name(c.self);
			statement("constant ", variable_decl(type, name), " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}